

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O1

void handleFileAction(efsw_watcher watcher,efsw_watchid watchid,char *dir,char *filename,
                     efsw_action action,char *oldFilename,void *param)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = action - EFSW_ADD;
  if (*oldFilename != '\0') {
    if (uVar1 < 4) {
      pcVar2 = (&PTR_anon_var_dwarf_68_0011ea10)[uVar1];
    }
    else {
      pcVar2 = "Bad Action";
    }
    printf("Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",watchid,dir,oldFilename,
           filename,pcVar2);
    return;
  }
  if (uVar1 < 4) {
    pcVar2 = (&PTR_anon_var_dwarf_68_0011ea10)[uVar1];
  }
  else {
    pcVar2 = "Bad Action";
  }
  printf("Watch ID %ld DIR (%s) FILE (%s) has event %s\n",watchid,dir,filename,pcVar2);
  return;
}

Assistant:

void handleFileAction( efsw_watcher watcher, efsw_watchid watchid, 
						const char* dir, const char* filename,
						enum efsw_action action, const char* oldFilename,
						void* param ) {
	if ( strlen( oldFilename ) == 0 ) {
		printf( "Watch ID %ld DIR (%s) FILE (%s) has event %s\n", 
			watchid, dir, filename, getActionName( action ));
	} else {
		printf( "Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",
			watchid, dir, oldFilename, filename, getActionName( action ));
	}
}